

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOD.h
# Opt level: O1

void __thiscall
dg::DODRanganath::coloredDAG
          (DODRanganath *this,CDGraph *graph,CDNode *n,
          set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_> *visited)

{
  Color CVar1;
  pointer ppCVar2;
  CDNode *pCVar3;
  mapped_type *pmVar4;
  const_iterator __begin3;
  pointer ppCVar5;
  pointer ppCVar6;
  Color CVar7;
  pair<std::_Rb_tree_iterator<dg::CDNode_*>,_bool> pVar8;
  CDNode *q;
  CDNode *s;
  CDNode *local_48;
  CDNode *local_40;
  CDNode *local_38;
  
  local_48 = n;
  pVar8 = std::
          _Rb_tree<dg::CDNode*,dg::CDNode*,std::_Identity<dg::CDNode*>,std::less<dg::CDNode*>,std::allocator<dg::CDNode*>>
          ::_M_insert_unique<dg::CDNode*const&>
                    ((_Rb_tree<dg::CDNode*,dg::CDNode*,std::_Identity<dg::CDNode*>,std::less<dg::CDNode*>,std::allocator<dg::CDNode*>>
                      *)visited,&local_48);
  pCVar3 = local_48;
  if (((undefined1  [16])pVar8 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    ppCVar5 = (local_48->super_ElemWithEdges<dg::CDNode>)._successors.
              super__Vector_base<dg::CDNode_*,_std::allocator<dg::CDNode_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    ppCVar2 = (local_48->super_ElemWithEdges<dg::CDNode>)._successors.
              super__Vector_base<dg::CDNode_*,_std::allocator<dg::CDNode_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    if (ppCVar5 != ppCVar2) {
      do {
        coloredDAG(this,graph,*ppCVar5,visited);
        ppCVar5 = ppCVar5 + 1;
      } while (ppCVar5 != ppCVar2);
      local_38 = *(pCVar3->super_ElemWithEdges<dg::CDNode>)._successors.
                  super__Vector_base<dg::CDNode_*,_std::allocator<dg::CDNode_*>_>._M_impl.
                  super__Vector_impl_data._M_start;
      pmVar4 = std::__detail::
               _Map_base<dg::CDNode_*,_std::pair<dg::CDNode_*const,_dg::DODRanganath::Info>,_std::allocator<std::pair<dg::CDNode_*const,_dg::DODRanganath::Info>_>,_std::__detail::_Select1st,_std::equal_to<dg::CDNode_*>,_std::hash<dg::CDNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<dg::CDNode_*,_std::pair<dg::CDNode_*const,_dg::DODRanganath::Info>,_std::allocator<std::pair<dg::CDNode_*const,_dg::DODRanganath::Info>_>,_std::__detail::_Select1st,_std::equal_to<dg::CDNode_*>,_std::hash<dg::CDNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)this,&local_38);
      CVar1 = pmVar4->color;
      ppCVar5 = (pCVar3->super_ElemWithEdges<dg::CDNode>)._successors.
                super__Vector_base<dg::CDNode_*,_std::allocator<dg::CDNode_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      ppCVar2 = (pCVar3->super_ElemWithEdges<dg::CDNode>)._successors.
                super__Vector_base<dg::CDNode_*,_std::allocator<dg::CDNode_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
      CVar7 = CVar1;
      if (ppCVar5 != ppCVar2) {
        do {
          ppCVar6 = ppCVar5 + 1;
          local_40 = *ppCVar5;
          pmVar4 = std::__detail::
                   _Map_base<dg::CDNode_*,_std::pair<dg::CDNode_*const,_dg::DODRanganath::Info>,_std::allocator<std::pair<dg::CDNode_*const,_dg::DODRanganath::Info>_>,_std::__detail::_Select1st,_std::equal_to<dg::CDNode_*>,_std::hash<dg::CDNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                   ::operator[]((_Map_base<dg::CDNode_*,_std::pair<dg::CDNode_*const,_dg::DODRanganath::Info>,_std::allocator<std::pair<dg::CDNode_*const,_dg::DODRanganath::Info>_>,_std::__detail::_Select1st,_std::equal_to<dg::CDNode_*>,_std::hash<dg::CDNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                 *)this,&local_40);
          CVar7 = UNCOLORED;
          if (pmVar4->color != CVar1) break;
          CVar7 = CVar1;
          ppCVar5 = ppCVar6;
        } while (ppCVar6 != ppCVar2);
      }
      pmVar4 = std::__detail::
               _Map_base<dg::CDNode_*,_std::pair<dg::CDNode_*const,_dg::DODRanganath::Info>,_std::allocator<std::pair<dg::CDNode_*const,_dg::DODRanganath::Info>_>,_std::__detail::_Select1st,_std::equal_to<dg::CDNode_*>,_std::hash<dg::CDNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<dg::CDNode_*,_std::pair<dg::CDNode_*const,_dg::DODRanganath::Info>,_std::allocator<std::pair<dg::CDNode_*const,_dg::DODRanganath::Info>_>,_std::__detail::_Select1st,_std::equal_to<dg::CDNode_*>,_std::hash<dg::CDNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)this,&local_48);
      pmVar4->color = CVar7;
    }
  }
  return;
}

Assistant:

void coloredDAG(CDGraph &graph, CDNode *n, std::set<CDNode *> &visited) {
        if (visited.insert(n).second) {
            const auto &successors = n->successors();
            if (successors.empty())
                return;

            for (auto *q : successors) {
                coloredDAG(graph, q, visited);
            }
            auto *s = *(successors.begin());
            auto c = data[s].color;
            for (auto *q : successors) {
                if (data[q].color != c) {
                    c = Color::UNCOLORED;
                    break;
                }
            }
            data[n].color = c;
        }
    }